

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_templates.cpp
# Opt level: O0

int main(void)

{
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_Type,_Type,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  *this;
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_Number,_Number,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  *this_00;
  dependency dVar1;
  element_type *peVar2;
  shared_ptr<hello<world<int>,_int>_> hw_1;
  hello<world<int>,_int> hw;
  undefined1 local_28 [8];
  i injector;
  int i;
  
  injector.super_injector_t._20_4_ = 0;
  injector.super_injector_t._16_4_ = 0x2a;
  this = boost::ext::di::v1_3_0::core::
         dependency<boost::ext::di::v1_3_0::scopes::deduce,_Type,_Type,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
         ::operator()((dependency<boost::ext::di::v1_3_0::scopes::deduce,_Type,_Type,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                       *)&boost::ext::di::v1_3_0::bind<Type>);
  boost::ext::di::v1_3_0::core::
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_Type,_Type,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  ::to<world>(this);
  this_00 = boost::ext::di::v1_3_0::core::
            dependency<boost::ext::di::v1_3_0::scopes::deduce,_Number,_Number,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
            ::operator()((dependency<boost::ext::di::v1_3_0::scopes::deduce,_Number,_Number,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                          *)&boost::ext::di::v1_3_0::bind<Number>);
  dVar1 = boost::ext::di::v1_3_0::core::
          dependency<boost::ext::di::v1_3_0::scopes::deduce,_Number,_Number,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
          ::to<int,_int_&,_0,_0>(this_00,(int *)&injector.super_injector_t.field_0x10);
  boost::ext::di::v1_3_0::
  make_injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_Type,_boost::ext::di::v1_3_0::aux::identity<world<int>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::concepts::any_of<Number,_int>,_int_&,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_0,_0>
            (local_28,dVar1.
                      super_scope<boost::ext::di::v1_3_0::concepts::any_of<Number,_int>,_int_&,_int>
                      .object_.object);
  hw_1.super___shared_ptr<hello<world<int>,_int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = boost::ext::di::v1_3_0::core::
          injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_Type,_boost::ext::di::v1_3_0::aux::identity<world<int>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::concepts::any_of<Number,_int>,_int_&,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
          ::create<hello,_hello<world<int>,_int>,_0>
                    ((injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_Type,_boost::ext::di::v1_3_0::aux::identity<world<int>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::concepts::any_of<Number,_int>,_int_&,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
                      *)local_28);
  if (hw_1.super___shared_ptr<hello<world<int>,_int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ != 0x2a) {
    __assert_fail("42 == hw.number",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bind_templates.cpp"
                  ,0x31,"int main()");
  }
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_Type,_boost::ext::di::v1_3_0::aux::identity<world<int>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::concepts::any_of<Number,_int>,_int_&,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  ::create<std::shared_ptr<hello<world<int>,_int>_>,_0>
            ((injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_Type,_boost::ext::di::v1_3_0::aux::identity<world<int>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::concepts::any_of<Number,_int>,_int_&,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
              *)&stack0xffffffffffffffb0);
  peVar2 = std::
           __shared_ptr_access<hello<world<int>,_int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hello<world<int>,_int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&stack0xffffffffffffffb0);
  if (peVar2->number == 0x2a) {
    std::shared_ptr<hello<world<int>,_int>_>::~shared_ptr
              ((shared_ptr<hello<world<int>,_int>_> *)&stack0xffffffffffffffb0);
    return injector.super_injector_t._20_4_;
  }
  __assert_fail("42 == hw->number",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bind_templates.cpp"
                ,0x38,"int main()");
}

Assistant:

int main() {
  auto i = 42;

  // clang-format off
  const auto injector = di::make_injector(
     di::bind<class Type>().to<world>()
   , di::bind<class Number>().to<int>(i)
  );
  // clang-format on

  {
    const auto hw = injector.create<hello>();

    static_assert(std::is_same<int, decltype(hw)::type::type>{}, "Type != int");
    assert(42 == hw.number);
  }

  {
    const auto hw = injector.create<std::shared_ptr<decltype(injector.create<hello>())>>();

    static_assert(std::is_same<int, decltype(hw)::element_type::type::type>{}, "Type != int");
    assert(42 == hw->number);
  }
}